

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  bool bVar21;
  undefined1 auVar22 [14];
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [13];
  undefined1 auVar27 [13];
  undefined1 auVar28 [13];
  undefined1 auVar29 [13];
  undefined1 auVar30 [13];
  undefined1 auVar31 [13];
  undefined1 auVar32 [16];
  undefined1 auVar33 [14];
  undefined1 auVar34 [12];
  unkbyte10 Var35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  uint uVar38;
  int iVar39;
  long lVar40;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar41;
  long lVar42;
  Scene *pSVar43;
  RTCFilterFunctionN p_Var44;
  RTCRayN *pRVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar54;
  ulong uVar55;
  undefined4 uVar56;
  ulong uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  float fVar71;
  float fVar94;
  float fVar96;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar95;
  float fVar97;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar99;
  float fVar115;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar116;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar140;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar142;
  float fVar149;
  float fVar151;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar152;
  undefined1 auVar147 [16];
  float fVar150;
  undefined1 auVar148 [16];
  float fVar153;
  float fVar154;
  float fVar159;
  float fVar161;
  undefined1 auVar155 [16];
  float fVar160;
  float fVar162;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar163;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  byte bVar170;
  char cVar171;
  float fVar172;
  float fVar173;
  byte bVar189;
  char cVar190;
  byte bVar191;
  char cVar192;
  char cVar193;
  char cVar194;
  float fVar195;
  char cVar197;
  char cVar198;
  byte bVar200;
  float fVar201;
  undefined1 auVar177 [16];
  undefined1 auVar184 [16];
  float fVar196;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar215 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  uint uVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  uint uVar242;
  float fVar243;
  float fVar244;
  uint uVar245;
  float fVar246;
  float fVar247;
  uint uVar248;
  float fVar249;
  uint uVar250;
  undefined8 local_1398;
  undefined8 uStack_1390;
  float fStack_1380;
  float fStack_137c;
  float fStack_1340;
  float fStack_133c;
  undefined1 local_1338 [8];
  undefined8 uStack_1330;
  vbool<4> valid;
  undefined1 local_1318 [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined1 local_12c8 [8];
  float fStack_12c0;
  float fStack_12bc;
  float fStack_1290;
  float fStack_128c;
  float fStack_127c;
  vfloat<4> tNear;
  float local_1208 [4];
  float local_11f8 [4];
  float local_11e8 [4];
  float local_11d8 [4];
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined1 local_11b8 [16];
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  ulong local_1160;
  ulong local_1158;
  ulong local_1150;
  ulong local_1148;
  ulong local_1140;
  ulong local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  StackItemT<embree::NodeRefPtr<4>_> *local_1118;
  long local_1110;
  long local_1108;
  ulong local_1100;
  ulong local_10f8;
  long local_10f0;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [8];
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  vint<4> sx;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar178 [16];
  undefined1 auVar174 [11];
  undefined1 auVar179 [16];
  undefined1 auVar185 [16];
  undefined1 auVar175 [12];
  undefined1 auVar180 [16];
  undefined1 auVar176 [13];
  undefined1 auVar181 [16];
  undefined1 auVar186 [16];
  undefined1 auVar183 [16];
  undefined1 auVar182 [16];
  undefined2 uVar199;
  
  local_1118 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar56 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar153 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar146._4_4_ = uVar56;
  auVar146._0_4_ = uVar56;
  auVar146._8_4_ = uVar56;
  auVar146._12_4_ = uVar56;
  auVar105._4_4_ = uVar3;
  auVar105._0_4_ = uVar3;
  auVar105._8_4_ = uVar3;
  auVar105._12_4_ = uVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_10c8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_10c4 = local_10c8;
  fStack_10c0 = local_10c8;
  fStack_10bc = local_10c8;
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar52 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar53 = uVar51 ^ 0x10;
  uVar48 = uVar52 ^ 0x10;
  uVar49 = uVar57 ^ 0x10;
  iVar5 = (tray->tnear).field_0.i[k];
  local_1178 = (float)(tray->tfar).field_0.i[k];
  fStack_1174 = local_1178;
  fStack_1170 = local_1178;
  fStack_116c = local_1178;
  local_1138 = uVar51 >> 2;
  local_1140 = uVar53 >> 2;
  local_1148 = uVar52 >> 2;
  local_1150 = uVar48 >> 2;
  local_1158 = uVar57 >> 2;
  local_1160 = uVar49 >> 2;
  lVar40 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1008 = auVar146;
  local_1018 = auVar105;
  local_11a8 = fVar153;
  fStack_11a4 = fVar153;
  fStack_11a0 = fVar153;
  fStack_119c = fVar153;
  local_1028 = fVar95;
  fStack_1024 = fVar95;
  fStack_1020 = fVar95;
  fStack_101c = fVar95;
  local_1120 = uVar51;
  local_1128 = uVar52;
  local_1130 = uVar57;
  local_10f8 = uVar53;
  local_1100 = uVar48;
  fVar163 = fVar153;
  fVar172 = fVar153;
  fVar159 = fVar153;
  fVar142 = fVar95;
  fVar243 = fVar95;
  fVar162 = fVar95;
LAB_0066d611:
  do {
    do {
      if (local_1118 == stack) {
        return;
      }
      pSVar41 = local_1118 + -1;
      local_1118 = local_1118 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar41->dist &&
             (float)pSVar41->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar41 = stack;
    pSVar54 = (StackItemT<embree::NodeRefPtr<4>_> *)(local_1118->ptr).ptr;
    while (((ulong)pSVar54 & 8) == 0) {
      pfVar1 = (float *)((long)&pSVar54[2].ptr.ptr + uVar51);
      auVar101._0_4_ = (*pfVar1 - auVar146._0_4_) * fVar95;
      auVar101._4_4_ = (pfVar1[1] - auVar146._4_4_) * fVar142;
      auVar101._8_4_ = (pfVar1[2] - auVar146._8_4_) * fVar243;
      auVar101._12_4_ = (pfVar1[3] - auVar146._12_4_) * fVar162;
      pfVar1 = (float *)((long)&pSVar54[2].ptr.ptr + uVar52);
      auVar144._0_4_ = (*pfVar1 - auVar105._0_4_) * fVar4;
      auVar144._4_4_ = (pfVar1[1] - auVar105._4_4_) * fVar4;
      auVar144._8_4_ = (pfVar1[2] - auVar105._8_4_) * fVar4;
      auVar144._12_4_ = (pfVar1[3] - auVar105._12_4_) * fVar4;
      auVar61 = maxps(auVar101,auVar144);
      pfVar1 = (float *)((long)&pSVar54[2].ptr.ptr + uVar57);
      auVar72._0_4_ = (*pfVar1 - fVar153) * local_10c8;
      auVar72._4_4_ = (pfVar1[1] - fVar163) * fStack_10c4;
      auVar72._8_4_ = (pfVar1[2] - fVar172) * fStack_10c0;
      auVar72._12_4_ = (pfVar1[3] - fVar159) * fStack_10bc;
      pfVar1 = (float *)((long)&pSVar54[2].ptr.ptr + uVar53);
      auVar100._0_4_ = (*pfVar1 - auVar146._0_4_) * fVar95;
      auVar100._4_4_ = (pfVar1[1] - auVar146._4_4_) * fVar142;
      auVar100._8_4_ = (pfVar1[2] - auVar146._8_4_) * fVar243;
      auVar100._12_4_ = (pfVar1[3] - auVar146._12_4_) * fVar162;
      pfVar1 = (float *)((long)&pSVar54[2].ptr.ptr + uVar48);
      auVar118._0_4_ = (*pfVar1 - auVar105._0_4_) * fVar4;
      auVar118._4_4_ = (pfVar1[1] - auVar105._4_4_) * fVar4;
      auVar118._8_4_ = (pfVar1[2] - auVar105._8_4_) * fVar4;
      auVar118._12_4_ = (pfVar1[3] - auVar105._12_4_) * fVar4;
      auVar101 = minps(auVar100,auVar118);
      pfVar1 = (float *)((long)&pSVar54[2].ptr.ptr + uVar49);
      auVar119._0_4_ = (*pfVar1 - fVar153) * local_10c8;
      auVar119._4_4_ = (pfVar1[1] - fVar163) * fStack_10c4;
      auVar119._8_4_ = (pfVar1[2] - fVar172) * fStack_10c0;
      auVar119._12_4_ = (pfVar1[3] - fVar159) * fStack_10bc;
      auVar73._4_4_ = iVar5;
      auVar73._0_4_ = iVar5;
      auVar73._8_4_ = iVar5;
      auVar73._12_4_ = iVar5;
      auVar73 = maxps(auVar72,auVar73);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar61,auVar73);
      auVar61._4_4_ = fStack_1174;
      auVar61._0_4_ = local_1178;
      auVar61._8_4_ = fStack_1170;
      auVar61._12_4_ = fStack_116c;
      auVar73 = minps(auVar119,auVar61);
      auVar73 = minps(auVar101,auVar73);
      auVar134._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar73._4_4_);
      auVar134._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar73._0_4_);
      auVar134._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar73._8_4_);
      auVar134._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar73._12_4_);
      uVar38 = movmskps((int)pSVar41,auVar134);
      if (uVar38 == 0) goto LAB_0066d611;
      uVar38 = uVar38 & 0xff;
      uVar55 = (ulong)pSVar54 & 0xfffffffffffffff0;
      lVar42 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
        }
      }
      pSVar41 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar55 + lVar42 * 8);
      uVar38 = uVar38 - 1 & uVar38;
      pSVar54 = pSVar41;
      if (uVar38 != 0) {
        uVar7 = tNear.field_0.i[lVar42];
        lVar42 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
          }
        }
        pSVar54 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar55 + lVar42 * 8);
        uVar242 = tNear.field_0.i[lVar42];
        uVar38 = uVar38 - 1 & uVar38;
        if (uVar38 == 0) {
          if (uVar7 < uVar242) {
            (local_1118->ptr).ptr = (size_t)pSVar54;
            local_1118->dist = uVar242;
            local_1118 = local_1118 + 1;
            pSVar54 = pSVar41;
          }
          else {
            (local_1118->ptr).ptr = (size_t)pSVar41;
            local_1118->dist = uVar7;
            pSVar41 = pSVar54;
            local_1118 = local_1118 + 1;
          }
        }
        else {
          auVar62._8_4_ = uVar7;
          auVar62._0_8_ = pSVar41;
          auVar62._12_4_ = 0;
          auVar74._8_4_ = uVar242;
          auVar74._0_8_ = pSVar54;
          auVar74._12_4_ = 0;
          lVar42 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
            }
          }
          uVar8 = *(ulong *)(uVar55 + lVar42 * 8);
          iVar39 = tNear.field_0.i[lVar42];
          auVar102._8_4_ = iVar39;
          auVar102._0_8_ = uVar8;
          auVar102._12_4_ = 0;
          auVar120._8_4_ = -(uint)((int)uVar7 < (int)uVar242);
          uVar38 = uVar38 - 1 & uVar38;
          if (uVar38 == 0) {
            auVar120._4_4_ = auVar120._8_4_;
            auVar120._0_4_ = auVar120._8_4_;
            auVar120._12_4_ = auVar120._8_4_;
            auVar73 = auVar62 & auVar120 | ~auVar120 & auVar74;
            auVar61 = auVar74 & auVar120 | ~auVar120 & auVar62;
            auVar121._8_4_ = -(uint)(auVar73._8_4_ < iVar39);
            auVar121._0_8_ = CONCAT44(auVar121._8_4_,auVar121._8_4_);
            auVar121._12_4_ = auVar121._8_4_;
            pSVar41 = (StackItemT<embree::NodeRefPtr<4>_> *)
                      (~auVar121._0_8_ & uVar8 | auVar73._0_8_ & auVar121._0_8_);
            auVar73 = auVar102 & auVar121 | ~auVar121 & auVar73;
            auVar63._8_4_ = -(uint)(auVar61._8_4_ < auVar73._8_4_);
            auVar63._4_4_ = auVar63._8_4_;
            auVar63._0_4_ = auVar63._8_4_;
            auVar63._12_4_ = auVar63._8_4_;
            *local_1118 = (StackItemT<embree::NodeRefPtr<4>_>)
                          (~auVar63 & auVar61 | auVar73 & auVar63);
            local_1118[1] =
                 (StackItemT<embree::NodeRefPtr<4>_>)(auVar61 & auVar63 | ~auVar63 & auVar73);
            local_1118 = local_1118 + 2;
            pSVar54 = pSVar41;
          }
          else {
            lVar42 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            iVar46 = tNear.field_0.i[lVar42];
            auVar133._8_4_ = iVar46;
            auVar133._0_8_ = *(undefined8 *)(uVar55 + lVar42 * 8);
            auVar133._12_4_ = 0;
            auVar122._4_4_ = auVar120._8_4_;
            auVar122._0_4_ = auVar120._8_4_;
            auVar122._8_4_ = auVar120._8_4_;
            auVar122._12_4_ = auVar120._8_4_;
            auVar73 = auVar62 & auVar122 | ~auVar122 & auVar74;
            auVar61 = auVar74 & auVar122 | ~auVar122 & auVar62;
            auVar143._0_4_ = -(uint)(iVar39 < iVar46);
            auVar143._4_4_ = -(uint)(iVar39 < iVar46);
            auVar143._8_4_ = -(uint)(iVar39 < iVar46);
            auVar143._12_4_ = -(uint)(iVar39 < iVar46);
            auVar101 = auVar102 & auVar143 | ~auVar143 & auVar133;
            auVar144 = ~auVar143 & auVar102 | auVar133 & auVar143;
            auVar103._8_4_ = -(uint)(auVar61._8_4_ < auVar144._8_4_);
            auVar103._4_4_ = auVar103._8_4_;
            auVar103._0_4_ = auVar103._8_4_;
            auVar103._12_4_ = auVar103._8_4_;
            auVar134 = auVar61 & auVar103 | ~auVar103 & auVar144;
            auVar75._8_4_ = -(uint)(auVar73._8_4_ < auVar101._8_4_);
            auVar75._0_8_ = CONCAT44(auVar75._8_4_,auVar75._8_4_);
            auVar75._12_4_ = auVar75._8_4_;
            pSVar41 = (StackItemT<embree::NodeRefPtr<4>_> *)
                      (auVar73._0_8_ & auVar75._0_8_ | ~auVar75._0_8_ & auVar101._0_8_);
            auVar73 = ~auVar75 & auVar73 | auVar101 & auVar75;
            auVar64._8_4_ = -(uint)(auVar73._8_4_ < auVar134._8_4_);
            auVar64._4_4_ = auVar64._8_4_;
            auVar64._0_4_ = auVar64._8_4_;
            auVar64._12_4_ = auVar64._8_4_;
            *local_1118 = (StackItemT<embree::NodeRefPtr<4>_>)
                          (~auVar103 & auVar61 | auVar144 & auVar103);
            local_1118[1] =
                 (StackItemT<embree::NodeRefPtr<4>_>)(~auVar64 & auVar73 | auVar134 & auVar64);
            local_1118[2] =
                 (StackItemT<embree::NodeRefPtr<4>_>)(auVar73 & auVar64 | ~auVar64 & auVar134);
            local_1118 = local_1118 + 3;
            pSVar54 = pSVar41;
          }
        }
      }
    }
    local_1110 = (ulong)((uint)pSVar54 & 0xf) - 8;
    uVar55 = (ulong)pSVar54 & 0xfffffffffffffff0;
    for (local_1108 = 0; local_1108 != local_1110; local_1108 = local_1108 + 1) {
      lVar42 = local_1108 * 0x58;
      local_10f0 = lVar42 + uVar55;
      uVar6 = *(undefined8 *)(uVar55 + 0x20 + lVar42);
      uVar56 = *(undefined4 *)(uVar55 + 0x24 + lVar42);
      bVar200 = (byte)uVar6;
      bVar170 = (byte)uVar56;
      bVar12 = (byte)((ulong)uVar6 >> 8);
      bVar189 = (byte)((uint)uVar56 >> 8);
      bVar13 = (byte)((ulong)uVar6 >> 0x10);
      bVar191 = (byte)((uint)uVar56 >> 0x10);
      bVar18 = (byte)((uint)uVar56 >> 0x18);
      bVar14 = (byte)((ulong)uVar6 >> 0x18);
      cVar171 = -((byte)((bVar200 < bVar170) * bVar200 | (bVar200 >= bVar170) * bVar170) == bVar200)
      ;
      cVar190 = -((byte)((bVar12 < bVar189) * bVar12 | (bVar12 >= bVar189) * bVar189) == bVar12);
      cVar192 = -((byte)((bVar13 < bVar191) * bVar13 | (bVar13 >= bVar191) * bVar191) == bVar13);
      cVar193 = -((byte)((bVar14 < bVar18) * bVar14 | (bVar14 >= bVar18) * bVar18) == bVar14);
      cVar194 = -((char)((ulong)uVar6 >> 0x20) == '\0');
      cVar197 = -((char)((ulong)uVar6 >> 0x28) == '\0');
      cVar198 = -((char)((ulong)uVar6 >> 0x30) == '\0');
      bVar200 = -((char)((ulong)uVar6 >> 0x38) == '\0');
      auVar178._0_9_ = CONCAT18(0xff,(ulong)bVar200 << 0x38);
      auVar174._0_10_ = CONCAT19(0xff,auVar178._0_9_);
      auVar174[10] = 0xff;
      auVar175[0xb] = 0xff;
      auVar175._0_11_ = auVar174;
      auVar176[0xc] = 0xff;
      auVar176._0_12_ = auVar175;
      auVar183[0xd] = 0xff;
      auVar183._0_13_ = auVar176;
      fVar98 = *(float *)(uVar55 + 0x38 + lVar42);
      fVar117 = *(float *)(uVar55 + 0x3c + lVar42);
      fVar222 = *(float *)(uVar55 + 0x44 + lVar42);
      uVar38 = *(uint *)(local_1138 + 0x20 + local_10f0);
      auVar26[0xc] = (char)(uVar38 >> 0x18);
      auVar26._0_12_ = ZEXT712(0);
      uVar7 = *(uint *)(local_1140 + 0x20 + local_10f0);
      auVar27[0xc] = (char)(uVar7 >> 0x18);
      auVar27._0_12_ = ZEXT712(0);
      fVar206 = *(float *)(uVar55 + 0x48 + lVar42);
      uVar242 = *(uint *)(local_1148 + 0x20 + local_10f0);
      auVar28[0xc] = (char)(uVar242 >> 0x18);
      auVar28._0_12_ = ZEXT712(0);
      uVar245 = *(uint *)(local_1150 + 0x20 + local_10f0);
      auVar29[0xc] = (char)(uVar245 >> 0x18);
      auVar29._0_12_ = ZEXT712(0);
      fVar214 = *(float *)(uVar55 + 0x4c + lVar42);
      uVar248 = *(uint *)(local_1158 + 0x20 + local_10f0);
      auVar30[0xc] = (char)(uVar248 >> 0x18);
      auVar30._0_12_ = ZEXT712(0);
      uVar250 = *(uint *)(local_1160 + 0x20 + local_10f0);
      auVar31[0xc] = (char)(uVar250 >> 0x18);
      auVar31._0_12_ = ZEXT712(0);
      fVar150 = *(float *)(uVar55 + 0x40 + lVar42);
      auVar76._0_4_ = (((float)(uVar38 & 0xff) * fVar222 + fVar98) - auVar146._0_4_) * fVar95;
      auVar76._4_4_ = (((float)(uVar38 >> 8 & 0xff) * fVar222 + fVar98) - auVar146._4_4_) * fVar142;
      auVar76._8_4_ =
           (((float)(int)CONCAT32(auVar26._10_3_,(ushort)(byte)(uVar38 >> 0x10)) * fVar222 + fVar98)
           - auVar146._8_4_) * fVar243;
      auVar76._12_4_ =
           (((float)(uint3)(auVar26._10_3_ >> 0x10) * fVar222 + fVar98) - auVar146._12_4_) * fVar162
      ;
      auVar135._0_4_ = (((float)(uVar242 & 0xff) * fVar206 + fVar117) - auVar105._0_4_) * fVar4;
      auVar135._4_4_ = (((float)(uVar242 >> 8 & 0xff) * fVar206 + fVar117) - auVar105._4_4_) * fVar4
      ;
      auVar135._8_4_ =
           (((float)(int)CONCAT32(auVar28._10_3_,(ushort)(byte)(uVar242 >> 0x10)) * fVar206 +
            fVar117) - auVar105._8_4_) * fVar4;
      auVar135._12_4_ =
           (((float)(uint3)(auVar28._10_3_ >> 0x10) * fVar206 + fVar117) - auVar105._12_4_) * fVar4;
      auVar73 = maxps(auVar76,auVar135);
      auVar104._0_4_ = (((float)(uVar7 & 0xff) * fVar222 + fVar98) - auVar146._0_4_) * fVar95;
      auVar104._4_4_ = (((float)(uVar7 >> 8 & 0xff) * fVar222 + fVar98) - auVar146._4_4_) * fVar142;
      auVar104._8_4_ =
           (((float)(int)CONCAT32(auVar27._10_3_,(ushort)(byte)(uVar7 >> 0x10)) * fVar222 + fVar98)
           - auVar146._8_4_) * fVar243;
      auVar104._12_4_ =
           (((float)(uint3)(auVar27._10_3_ >> 0x10) * fVar222 + fVar98) - auVar146._12_4_) * fVar162
      ;
      auVar123._0_4_ = (((float)(uVar245 & 0xff) * fVar206 + fVar117) - auVar105._0_4_) * fVar4;
      auVar123._4_4_ = (((float)(uVar245 >> 8 & 0xff) * fVar206 + fVar117) - auVar105._4_4_) * fVar4
      ;
      auVar123._8_4_ =
           (((float)(int)CONCAT32(auVar29._10_3_,(ushort)(byte)(uVar245 >> 0x10)) * fVar206 +
            fVar117) - auVar105._8_4_) * fVar4;
      auVar123._12_4_ =
           (((float)(uint3)(auVar29._10_3_ >> 0x10) * fVar206 + fVar117) - auVar105._12_4_) * fVar4;
      auVar105 = minps(auVar104,auVar123);
      auVar145._0_4_ = (((float)(uVar248 & 0xff) * fVar214 + fVar150) - fVar153) * local_10c8;
      auVar145._4_4_ = (((float)(uVar248 >> 8 & 0xff) * fVar214 + fVar150) - fVar163) * fStack_10c4;
      auVar145._8_4_ =
           (((float)(int)CONCAT32(auVar30._10_3_,(ushort)(byte)(uVar248 >> 0x10)) * fVar214 +
            fVar150) - fVar172) * fStack_10c0;
      auVar145._12_4_ =
           (((float)(uint3)(auVar30._10_3_ >> 0x10) * fVar214 + fVar150) - fVar159) * fStack_10bc;
      auVar17._4_4_ = iVar5;
      auVar17._0_4_ = iVar5;
      auVar17._8_4_ = iVar5;
      auVar17._12_4_ = iVar5;
      auVar146 = maxps(auVar145,auVar17);
      dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar73,auVar146);
      auVar155._0_4_ = (((float)(uVar250 & 0xff) * fVar214 + fVar150) - fVar153) * local_10c8;
      auVar155._4_4_ = (((float)(uVar250 >> 8 & 0xff) * fVar214 + fVar150) - fVar163) * fStack_10c4;
      auVar155._8_4_ =
           (((float)(int)CONCAT32(auVar31._10_3_,(ushort)(byte)(uVar250 >> 0x10)) * fVar214 +
            fVar150) - fVar172) * fStack_10c0;
      auVar155._12_4_ =
           (((float)(uint3)(auVar31._10_3_ >> 0x10) * fVar214 + fVar150) - fVar159) * fStack_10bc;
      auVar32._4_4_ = fStack_1174;
      auVar32._0_4_ = local_1178;
      auVar32._8_4_ = fStack_1170;
      auVar32._12_4_ = fStack_116c;
      auVar146 = minps(auVar155,auVar32);
      auVar105 = minps(auVar105,auVar146);
      auVar183[0xe] = bVar200;
      auVar183[0xf] = bVar200;
      auVar182._14_2_ = auVar183._14_2_;
      auVar182[0xd] = cVar198;
      auVar182._0_13_ = auVar176;
      auVar181._13_3_ = auVar182._13_3_;
      auVar181[0xc] = cVar198;
      auVar181._0_12_ = auVar175;
      auVar180._12_4_ = auVar181._12_4_;
      auVar180[0xb] = cVar197;
      auVar180._0_11_ = auVar174;
      auVar179._11_5_ = auVar180._11_5_;
      auVar179[10] = cVar197;
      auVar179._0_10_ = auVar174._0_10_;
      auVar178._10_6_ = auVar179._10_6_;
      auVar178[9] = cVar194;
      Var35 = CONCAT91(CONCAT81((long)(CONCAT72(auVar178._9_7_,CONCAT11(cVar194,bVar200)) >> 8),
                                cVar193),cVar193);
      auVar34._2_10_ = Var35;
      auVar34[1] = cVar192;
      auVar34[0] = cVar192;
      auVar33._2_12_ = auVar34;
      auVar33[1] = cVar190;
      auVar33[0] = cVar190;
      auVar177._0_2_ = CONCAT11(cVar171,cVar171);
      auVar177._2_14_ = auVar33;
      uVar199 = (undefined2)Var35;
      auVar186._0_12_ = auVar177._0_12_;
      auVar186._12_2_ = uVar199;
      auVar186._14_2_ = uVar199;
      auVar185._12_4_ = auVar186._12_4_;
      auVar185._0_10_ = auVar177._0_10_;
      auVar185._10_2_ = auVar34._0_2_;
      auVar184._10_6_ = auVar185._10_6_;
      auVar184._0_8_ = auVar177._0_8_;
      auVar184._8_2_ = auVar34._0_2_;
      auVar36._4_8_ = auVar184._8_8_;
      auVar36._2_2_ = auVar33._0_2_;
      auVar36._0_2_ = auVar33._0_2_;
      uVar38 = CONCAT22(auVar177._0_2_,auVar177._0_2_);
      auVar77._0_4_ = -(uint)(dist.field_0._0_4_ <= auVar105._0_4_) & uVar38;
      auVar77._4_4_ = -(uint)(dist.field_0._4_4_ <= auVar105._4_4_) & auVar36._0_4_;
      auVar77._8_4_ = -(uint)(dist.field_0._8_4_ <= auVar105._8_4_) & auVar184._8_4_;
      auVar77._12_4_ = -(uint)(dist.field_0._12_4_ <= auVar105._12_4_) & auVar185._12_4_;
      uVar56 = movmskps((int)uVar57,auVar77);
      uVar51 = CONCAT44((int)(uVar57 >> 0x20),uVar56);
      while (uVar51 != 0) {
        lVar42 = 0;
        if (uVar51 != 0) {
          for (; (uVar51 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
          }
        }
        uVar51 = uVar51 & uVar51 - 1;
        fVar95 = *(float *)(ray + k * 4 + 0x80);
        if (*(float *)((long)&stack[-1].ptr.ptr + lVar42 * 4) <= fVar95) {
          uVar38 = *(uint *)(local_10f0 + 0x50);
          uVar7 = *(uint *)(local_10f0 + 4 + lVar42 * 8);
          pSVar43 = context->scene;
          pGVar9 = (pSVar43->geometries).items[uVar38].ptr;
          lVar10 = *(long *)&pGVar9->field_0x58;
          lVar11 = *(long *)&pGVar9[1].time_range.upper;
          lVar47 = (ulong)uVar7 *
                   pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar48 = *(ulong *)(local_10f0 + lVar42 * 8);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar48;
          auVar65 = auVar65 & _DAT_01f76ac0;
          auVar19._10_2_ = 0;
          auVar19._0_10_ = auVar65._0_10_;
          auVar19._12_2_ = auVar65._6_2_;
          auVar20._8_2_ = auVar65._4_2_;
          auVar20._0_8_ = auVar65._0_8_;
          auVar20._10_4_ = auVar19._10_4_;
          auVar37._6_8_ = 0;
          auVar37._0_6_ = auVar20._8_6_;
          auVar22._4_2_ = auVar65._2_2_;
          auVar22._0_4_ = auVar65._0_4_;
          auVar22._6_8_ = SUB148(auVar37 << 0x40,6);
          sx.field_0.i[0] = (int)auVar65._0_2_;
          uVar52 = *(ulong *)(lVar10 + lVar47);
          uVar53 = (ulong)(uint)((int)((ulong)(auVar65._0_4_ >> 0x10) * (uVar52 >> 0x20)) +
                                (int)uVar52 + sx.field_0.i[0]);
          p_Var44 = pGVar9[1].intersectionFilterN;
          pfVar1 = (float *)(lVar11 + (long)p_Var44 * uVar53);
          fVar153 = *pfVar1;
          fVar163 = pfVar1[1];
          fVar172 = pfVar1[2];
          pfVar1 = (float *)(lVar11 + (uVar53 + 1) * (long)p_Var44);
          fVar159 = *pfVar1;
          fVar142 = pfVar1[1];
          fVar243 = pfVar1[2];
          uVar52 = uVar52 >> 0x20;
          lVar50 = uVar53 + uVar52 + 1;
          pfVar1 = (float *)(lVar11 + (uVar53 + uVar52) * (long)p_Var44);
          fVar162 = *pfVar1;
          fVar98 = pfVar1[1];
          fVar117 = pfVar1[2];
          pfVar1 = (float *)(lVar11 + lVar50 * (long)p_Var44);
          fVar222 = *pfVar1;
          fVar206 = pfVar1[1];
          fVar214 = pfVar1[2];
          uVar57 = (ulong)(-1 < (short)uVar48);
          lVar42 = lVar11 + (uVar53 + uVar57 + 1) * (long)p_Var44;
          fVar150 = *(float *)(lVar42 + 4);
          fVar246 = *(float *)(lVar42 + 8);
          lVar42 = uVar57 + lVar50;
          pfVar1 = (float *)(lVar11 + lVar42 * (long)p_Var44);
          fVar224 = *pfVar1;
          fVar208 = pfVar1[1];
          fVar217 = pfVar1[2];
          uVar57 = 0;
          if (-1 < (short)(uVar48 >> 0x10)) {
            uVar57 = uVar52;
          }
          pfVar1 = (float *)(lVar11 + (uVar53 + uVar52 + uVar57) * (long)p_Var44);
          fVar116 = pfVar1[1];
          pfVar2 = (float *)(lVar11 + (lVar50 + uVar57) * (long)p_Var44);
          fVar212 = pfVar2[1];
          fVar115 = pfVar2[2];
          lVar42 = lVar11 + (uVar57 + lVar42) * (long)p_Var44;
          fVar210 = *(float *)(lVar42 + 4);
          fVar99 = *(float *)(lVar42 + 8);
          fVar232 = fVar163 - fVar142;
          fVar235 = fVar142 - fVar150;
          fVar237 = fVar206 - fVar208;
          fVar239 = fVar98 - fVar206;
          fVar132 = fVar172 - fVar243;
          fVar138 = fVar243 - fVar246;
          fVar139 = fVar214 - fVar217;
          fVar140 = fVar117 - fVar214;
          fVar241 = fVar98 - fVar163;
          fVar244 = fVar206 - fVar142;
          fVar247 = fVar212 - fVar206;
          fVar249 = fVar116 - fVar98;
          fVar141 = fVar117 - fVar172;
          fVar149 = fVar214 - fVar243;
          fVar151 = fVar115 - fVar214;
          fVar152 = pfVar1[2] - fVar117;
          local_1198 = fVar132 * fVar241 - fVar232 * fVar141;
          fStack_1194 = fVar138 * fVar244 - fVar235 * fVar149;
          fStack_1190 = fVar139 * fVar247 - fVar237 * fVar151;
          fStack_118c = fVar140 * fVar249 - fVar239 * fVar152;
          local_1188 = CONCAT44(fVar222,fVar162);
          local_1178 = *pfVar2;
          fStack_1174 = *pfVar1;
          fVar221 = fVar162 - fVar153;
          fVar223 = fVar222 - fVar159;
          fVar225 = *pfVar2 - fVar222;
          fVar226 = *pfVar1 - fVar162;
          fVar154 = *(float *)(ray + k * 4);
          fVar160 = *(float *)(ray + k * 4 + 0x10);
          local_12c8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
          fStack_127c = *(float *)(ray + k * 4 + 0x50);
          fVar205 = fVar153 - fVar154;
          fVar207 = fVar159 - fVar154;
          fVar209 = fVar222 - fVar154;
          fVar211 = fVar162 - fVar154;
          fVar163 = fVar163 - fVar160;
          fVar167 = fVar142 - fVar160;
          fVar168 = fVar206 - fVar160;
          fVar169 = fVar98 - fVar160;
          fVar213 = fVar205 * fStack_127c - fVar163 * (float)local_12c8._4_4_;
          fVar216 = fVar207 * fStack_127c - fVar167 * (float)local_12c8._4_4_;
          fVar218 = fVar209 * fStack_127c - fVar168 * (float)local_12c8._4_4_;
          fVar219 = fVar211 * fStack_127c - fVar169 * (float)local_12c8._4_4_;
          fVar153 = fVar153 - fVar99;
          fVar159 = fVar159 - fVar115;
          fVar161 = fVar222 - (float)uStack_1330;
          fVar162 = fVar162 - uStack_1330._4_4_;
          fVar71 = fVar153 * fVar141 - fVar132 * fVar221;
          fVar94 = fVar159 * fVar149 - fVar138 * fVar223;
          fVar96 = fVar161 * fVar151 - fVar139 * fVar225;
          fVar97 = fVar162 * fVar152 - fVar140 * fVar226;
          fVar220 = *(float *)(ray + k * 4 + 0x20);
          fVar234 = *(float *)(ray + k * 4 + 0x60);
          fVar172 = fVar172 - fVar220;
          fVar195 = fVar243 - fVar220;
          fVar201 = fVar214 - fVar220;
          fVar203 = fVar117 - fVar220;
          fVar173 = fVar172 * (float)local_12c8._4_4_ - fVar205 * fVar234;
          fVar196 = fVar195 * (float)local_12c8._4_4_ - fVar207 * fVar234;
          fVar202 = fVar201 * (float)local_12c8._4_4_ - fVar209 * fVar234;
          fVar204 = fVar203 * (float)local_12c8._4_4_ - fVar211 * fVar234;
          local_11b8._0_4_ = fVar232 * fVar221 - fVar153 * fVar241;
          local_11b8._4_4_ = fVar235 * fVar223 - fVar159 * fVar244;
          local_11b8._8_4_ = fVar237 * fVar225 - fVar161 * fVar247;
          local_11b8._12_4_ = fVar239 * fVar226 - fVar162 * fVar249;
          fVar233 = fVar163 * fVar234 - fVar172 * fStack_127c;
          fVar236 = fVar167 * fVar234 - fVar195 * fStack_127c;
          fVar238 = fVar168 * fVar234 - fVar201 * fStack_127c;
          fVar240 = fVar169 * fVar234 - fVar203 * fStack_127c;
          local_12c8._0_4_ = local_12c8._4_4_;
          fStack_12c0 = (float)local_12c8._4_4_;
          fStack_12bc = (float)local_12c8._4_4_;
          fVar228 = local_1198 * (float)local_12c8._4_4_ +
                    fVar71 * fStack_127c + local_11b8._0_4_ * fVar234;
          fVar229 = fStack_1194 * (float)local_12c8._4_4_ +
                    fVar94 * fStack_127c + local_11b8._4_4_ * fVar234;
          fVar230 = fStack_1190 * (float)local_12c8._4_4_ +
                    fVar96 * fStack_127c + local_11b8._8_4_ * fVar234;
          fVar231 = fStack_118c * (float)local_12c8._4_4_ +
                    fVar97 * fStack_127c + local_11b8._12_4_ * fVar234;
          uVar242 = (uint)fVar228 & 0x80000000;
          uVar245 = (uint)fVar229 & 0x80000000;
          uVar248 = (uint)fVar230 & 0x80000000;
          uVar250 = (uint)fVar231 & 0x80000000;
          fVar141 = (float)((uint)(fVar221 * fVar233 + fVar241 * fVar173 + fVar141 * fVar213) ^
                           uVar242);
          fVar149 = (float)((uint)(fVar223 * fVar236 + fVar244 * fVar196 + fVar149 * fVar216) ^
                           uVar245);
          fVar151 = (float)((uint)(fVar225 * fVar238 + fVar247 * fVar202 + fVar151 * fVar218) ^
                           uVar248);
          fVar152 = (float)((uint)(fVar226 * fVar240 + fVar249 * fVar204 + fVar152 * fVar219) ^
                           uVar250);
          fVar132 = (float)((uint)(fVar233 * fVar153 + fVar173 * fVar232 + fVar213 * fVar132) ^
                           uVar242);
          fVar138 = (float)((uint)(fVar236 * fVar159 + fVar196 * fVar235 + fVar216 * fVar138) ^
                           uVar245);
          fVar139 = (float)((uint)(fVar238 * fVar161 + fVar202 * fVar237 + fVar218 * fVar139) ^
                           uVar248);
          fVar162 = (float)((uint)(fVar240 * fVar162 + fVar204 * fVar239 + fVar219 * fVar140) ^
                           uVar250);
          fVar153 = ABS(fVar228);
          fVar159 = ABS(fVar229);
          auVar147._0_8_ = CONCAT44(fVar229,fVar228) & 0x7fffffff7fffffff;
          auVar147._8_4_ = ABS(fVar230);
          auVar147._12_4_ = ABS(fVar231);
          bVar24 = ((0.0 <= fVar132 && 0.0 <= fVar141) && fVar228 != 0.0) &&
                   fVar141 + fVar132 <= fVar153;
          auVar215._0_4_ = -(uint)bVar24;
          bVar25 = ((0.0 <= fVar138 && 0.0 <= fVar149) && fVar229 != 0.0) &&
                   fVar149 + fVar138 <= fVar159;
          auVar215._4_4_ = -(uint)bVar25;
          bVar23 = ((0.0 <= fVar139 && 0.0 <= fVar151) && fVar230 != 0.0) &&
                   fVar151 + fVar139 <= auVar147._8_4_;
          auVar215._8_4_ = -(uint)bVar23;
          bVar21 = ((0.0 <= fVar162 && 0.0 <= fVar152) && fVar231 != 0.0) &&
                   fVar152 + fVar162 <= auVar147._12_4_;
          auVar215._12_4_ = -(uint)bVar21;
          iVar46 = movmskps((int)lVar11,auVar215);
          local_12d8._4_4_ = auVar22._4_4_;
          iVar39 = local_12d8._4_4_;
          local_10d8 = ZEXT416(uVar38);
          local_10e8 = ZEXT416(uVar7);
          sx.field_0.i[1] = sx.field_0.i[0];
          sx.field_0.i[2] = sx.field_0.i[0];
          sx.field_0.i[3] = sx.field_0.i[0];
          if (iVar46 == 0) {
LAB_0066df81:
            uVar242 = (uint)pSVar43;
          }
          else {
            fVar195 = fVar195 * local_11b8._4_4_;
            fVar201 = fVar201 * local_11b8._8_4_;
            fVar203 = fVar203 * local_11b8._12_4_;
            fVar172 = (float)(uVar242 ^
                             (uint)(fVar205 * local_1198 +
                                   fVar163 * fVar71 + fVar172 * local_11b8._0_4_));
            fVar140 = (float)(uVar245 ^ (uint)(fVar207 * fStack_1194 + fVar167 * fVar94 + fVar195));
            fVar161 = (float)(uVar248 ^ (uint)(fVar209 * fStack_1190 + fVar168 * fVar96 + fVar201));
            fVar167 = (float)(uVar250 ^ (uint)(fVar211 * fStack_118c + fVar169 * fVar97 + fVar203));
            fVar163 = *(float *)(ray + k * 4 + 0x30);
            valid.field_0.i[0] =
                 -(uint)((fVar172 <= fVar95 * fVar153 && fVar163 * fVar153 < fVar172) && bVar24);
            valid.field_0.i[1] =
                 -(uint)((fVar140 <= fVar95 * fVar159 && fVar163 * fVar159 < fVar140) && bVar25);
            valid.field_0.i[2] =
                 -(uint)((fVar161 <= fVar95 * auVar147._8_4_ && fVar163 * auVar147._8_4_ < fVar161)
                        && bVar23);
            valid.field_0.i[3] =
                 -(uint)((fVar167 <= fVar95 * auVar147._12_4_ && fVar163 * auVar147._12_4_ < fVar167
                         ) && bVar21);
            iVar46 = movmskps(iVar46,(undefined1  [16])valid.field_0);
            if (iVar46 == 0) goto LAB_0066df81;
            local_11d8[0] = local_1198;
            local_11d8[1] = fStack_1194;
            local_11d8[2] = fStack_1190;
            local_11d8[3] = fStack_118c;
            local_11c8 = CONCAT44(fVar94,fVar71);
            uStack_11c0 = CONCAT44(fVar97,fVar96);
            auVar127._4_12_ = local_11b8._4_12_;
            auVar127._0_4_ = (float)(int)(*(ushort *)(lVar10 + 8 + lVar47) - 1);
            auVar187._4_4_ = local_11b8._4_4_;
            auVar187._0_4_ = auVar127._0_4_;
            auVar187._8_4_ = local_11b8._8_4_;
            auVar187._12_4_ = local_11b8._12_4_;
            auVar105 = rcpss(auVar187,auVar127);
            fVar163 = (float)(int)(*(ushort *)(lVar10 + 10 + lVar47) - 1);
            fVar95 = (2.0 - auVar127._0_4_ * auVar105._0_4_) * auVar105._0_4_;
            auVar188._4_4_ = fVar195;
            auVar188._0_4_ = fVar163;
            auVar188._8_4_ = fVar201;
            auVar188._12_4_ = fVar203;
            auVar15._4_4_ = fVar195;
            auVar15._0_4_ = fVar163;
            auVar15._8_4_ = fVar201;
            auVar15._12_4_ = fVar203;
            auVar105 = rcpss(auVar188,auVar15);
            fVar163 = (2.0 - fVar163 * auVar105._0_4_) * auVar105._0_4_;
            tNear.field_0.v[0] = fVar95 * ((float)sx.field_0.i[0] * fVar153 + fVar141);
            tNear.field_0.v[1] = fVar95 * ((float)(sx.field_0.i[0] + 1) * fVar159 + fVar149);
            tNear.field_0.v[2] = fVar95 * ((float)(sx.field_0.i[0] + 1) * auVar147._8_4_ + fVar151);
            tNear.field_0.v[3] = fVar95 * ((float)sx.field_0.i[0] * auVar147._12_4_ + fVar152);
            auVar80._0_4_ = (float)local_12d8._4_4_ * fVar153 + fVar132;
            auVar80._4_4_ = (float)local_12d8._4_4_ * fVar159 + fVar138;
            auVar80._8_4_ = (float)(local_12d8._4_4_ + 1) * auVar147._8_4_ + fVar139;
            auVar80._12_4_ = (float)(local_12d8._4_4_ + 1) * auVar147._12_4_ + fVar162;
            pGVar9 = (pSVar43->geometries).items[uVar38].ptr;
            uVar242 = *(uint *)(ray + k * 4 + 0x90);
            pSVar43 = (Scene *)(ulong)uVar242;
            if ((pGVar9->mask & uVar242) == 0) goto LAB_0066df81;
            auVar105 = rcpps(auVar80,auVar147);
            fVar95 = auVar105._0_4_;
            fVar162 = auVar105._4_4_;
            fVar71 = auVar105._8_4_;
            fVar94 = auVar105._12_4_;
            fVar95 = (1.0 - fVar153 * fVar95) * fVar95 + fVar95;
            fVar162 = (1.0 - fVar159 * fVar162) * fVar162 + fVar162;
            fVar71 = (1.0 - auVar147._8_4_ * fVar71) * fVar71 + fVar71;
            fVar94 = (1.0 - auVar147._12_4_ * fVar94) * fVar94 + fVar94;
            fVar172 = fVar172 * fVar95;
            fVar140 = fVar140 * fVar162;
            fVar161 = fVar161 * fVar71;
            fVar167 = fVar167 * fVar94;
            local_11e8[0] = fVar172;
            local_11e8[1] = fVar140;
            local_11e8[2] = fVar161;
            local_11e8[3] = fVar167;
            local_1208[0] = tNear.field_0.v[0] * fVar95;
            local_1208[1] = tNear.field_0.v[1] * fVar162;
            local_1208[2] = tNear.field_0.v[2] * fVar71;
            local_1208[3] = tNear.field_0.v[3] * fVar94;
            local_11f8[0] = fVar163 * auVar80._0_4_ * fVar95;
            local_11f8[1] = fVar163 * auVar80._4_4_ * fVar162;
            local_11f8[2] = fVar163 * auVar80._8_4_ * fVar71;
            local_11f8[3] = fVar163 * auVar80._12_4_ * fVar94;
            auVar81._0_4_ = (uint)fVar172 & valid.field_0.i[0];
            auVar81._4_4_ = (uint)fVar140 & valid.field_0.i[1];
            auVar81._8_4_ = (uint)fVar161 & valid.field_0.i[2];
            auVar81._12_4_ = (uint)fVar167 & valid.field_0.i[3];
            auVar128._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
            auVar128._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
            auVar128._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
            auVar128 = auVar128 | auVar81;
            auVar82._4_4_ = auVar128._0_4_;
            auVar82._0_4_ = auVar128._4_4_;
            auVar82._8_4_ = auVar128._12_4_;
            auVar82._12_4_ = auVar128._8_4_;
            auVar105 = minps(auVar82,auVar128);
            auVar108._0_8_ = auVar105._8_8_;
            auVar108._8_4_ = auVar105._0_4_;
            auVar108._12_4_ = auVar105._4_4_;
            auVar105 = minps(auVar108,auVar105);
            uVar227 = -(uint)(auVar105._0_4_ == auVar128._0_4_);
            uVar58 = -(uint)(auVar105._4_4_ == auVar128._4_4_);
            uVar59 = -(uint)(auVar105._8_4_ == auVar128._8_4_);
            uVar60 = -(uint)(auVar105._12_4_ == auVar128._12_4_);
            auVar83._0_4_ = uVar227 & valid.field_0.i[0];
            auVar83._4_4_ = uVar58 & valid.field_0.i[1];
            auVar83._8_4_ = uVar59 & valid.field_0.i[2];
            auVar83._12_4_ = uVar60 & valid.field_0.i[3];
            iVar46 = movmskps(uVar242,auVar83);
            uVar242 = 0xffffffff;
            uVar245 = 0xffffffff;
            uVar248 = 0xffffffff;
            uVar250 = 0xffffffff;
            if (iVar46 != 0) {
              uVar242 = uVar227;
              uVar245 = uVar58;
              uVar248 = uVar59;
              uVar250 = uVar60;
            }
            auVar166._0_4_ = valid.field_0.i[0] & uVar242;
            auVar166._4_4_ = valid.field_0.i[1] & uVar245;
            auVar166._8_4_ = valid.field_0.i[2] & uVar248;
            auVar166._12_4_ = valid.field_0.i[3] & uVar250;
            uVar242 = movmskps(iVar46,auVar166);
            lVar42 = 0;
            if (uVar242 != 0) {
              for (; (uVar242 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar153 = local_1208[lVar42];
              fVar163 = local_11f8[lVar42];
              fVar95 = local_11d8[lVar42];
              uVar56 = *(undefined4 *)((long)&local_11c8 + lVar42 * 4);
              uVar3 = *(undefined4 *)(local_11b8 + lVar42 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_11e8[lVar42];
              *(float *)(ray + k * 4 + 0xc0) = fVar95;
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar56;
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar3;
              *(float *)(ray + k * 4 + 0xf0) = fVar153;
              *(float *)(ray + k * 4 + 0x100) = fVar163;
              *(uint *)(ray + k * 4 + 0x110) = uVar7;
              *(uint *)(ray + k * 4 + 0x120) = uVar38;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar242 = context->user->instPrimID[0];
              *(uint *)(ray + k * 4 + 0x140) = uVar242;
            }
            else {
              local_12d8 = CONCAT44(uVar7,uVar7);
              uStack_12d0._0_4_ = uVar7;
              uStack_12d0._4_4_ = uVar7;
              uVar6 = *(undefined8 *)*(undefined1 (*) [12])(mm_lookupmask_ps + lVar40);
              local_1198 = (float)uVar6;
              fStack_1194 = (float)((ulong)uVar6 >> 0x20);
              fStack_1190 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar40 + 8);
              fStack_118c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar40 + 8) >> 0x20);
              _local_12c8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              while( true ) {
                local_1088 = local_1208[lVar42];
                local_1078._4_4_ = local_11f8[lVar42];
                *(float *)(ray + k * 4 + 0x80) = local_11e8[lVar42];
                args.context = context->user;
                local_10b8 = local_11d8[lVar42];
                local_10a8._4_4_ = *(undefined4 *)((long)&local_11c8 + lVar42 * 4);
                local_1098._4_4_ = *(undefined4 *)(local_11b8 + lVar42 * 4);
                fStack_10b4 = local_10b8;
                fStack_10b0 = local_10b8;
                fStack_10ac = local_10b8;
                local_10a8._0_4_ = local_10a8._4_4_;
                local_10a8._8_4_ = local_10a8._4_4_;
                local_10a8._12_4_ = local_10a8._4_4_;
                local_1098._0_4_ = local_1098._4_4_;
                local_1098._8_4_ = local_1098._4_4_;
                local_1098._12_4_ = local_1098._4_4_;
                fStack_1084 = local_1088;
                fStack_1080 = local_1088;
                fStack_107c = local_1088;
                local_1078._0_4_ = local_1078._4_4_;
                fStack_1070 = (float)local_1078._4_4_;
                fStack_106c = (float)local_1078._4_4_;
                local_1068 = local_12d8;
                uStack_1060 = uStack_12d0;
                local_1058 = CONCAT44(uVar38,uVar38);
                uStack_1050 = CONCAT44(uVar38,uVar38);
                local_1048 = (args.context)->instID[0];
                uStack_1044 = local_1048;
                uStack_1040 = local_1048;
                uStack_103c = local_1048;
                local_1038 = (args.context)->instPrimID[0];
                uStack_1034 = local_1038;
                uStack_1030 = local_1038;
                uStack_102c = local_1038;
                local_1318._4_4_ = fStack_1194;
                local_1318._0_4_ = local_1198;
                local_1318._8_4_ = fStack_1190;
                local_1318._12_4_ = fStack_118c;
                args.valid = (int *)local_1318;
                args.geometryUserPtr = pGVar9->userPtr;
                args.hit = (RTCHitN *)&local_10b8;
                args.N = 4;
                p_Var44 = pGVar9->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var44 != (RTCFilterFunctionN)0x0) {
                  p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                }
                auVar89._0_4_ = -(uint)(local_1318._0_4_ == 0);
                auVar89._4_4_ = -(uint)(local_1318._4_4_ == 0);
                auVar89._8_4_ = -(uint)(local_1318._8_4_ == 0);
                auVar89._12_4_ = -(uint)(local_1318._12_4_ == 0);
                uVar242 = movmskps((int)p_Var44,auVar89);
                pRVar45 = (RTCRayN *)(ulong)(uVar242 ^ 0xf);
                if ((uVar242 ^ 0xf) == 0) {
                  auVar89 = auVar89 ^ _DAT_01f46b70;
                }
                else {
                  p_Var44 = context->args->filter;
                  if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                  }
                  auVar69._0_4_ = -(uint)(local_1318._0_4_ == 0);
                  auVar69._4_4_ = -(uint)(local_1318._4_4_ == 0);
                  auVar69._8_4_ = -(uint)(local_1318._8_4_ == 0);
                  auVar69._12_4_ = -(uint)(local_1318._12_4_ == 0);
                  auVar89 = auVar69 ^ _DAT_01f46b70;
                  uVar242 = movmskps((int)p_Var44,auVar69);
                  pRVar45 = (RTCRayN *)(ulong)(uVar242 ^ 0xf);
                  if ((uVar242 ^ 0xf) != 0) {
                    uVar242 = *(uint *)(args.hit + 4);
                    uVar245 = *(uint *)(args.hit + 8);
                    uVar248 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar69._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar69._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar69._4_4_ & uVar242 | *(uint *)(args.ray + 0xc4) & auVar69._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar69._8_4_ & uVar245 | *(uint *)(args.ray + 200) & auVar69._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar69._12_4_ & uVar248 | *(uint *)(args.ray + 0xcc) & auVar69._12_4_;
                    uVar242 = *(uint *)(args.hit + 0x14);
                    uVar245 = *(uint *)(args.hit + 0x18);
                    uVar248 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar69._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar69._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar69._4_4_ & uVar242 | *(uint *)(args.ray + 0xd4) & auVar69._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar69._8_4_ & uVar245 | *(uint *)(args.ray + 0xd8) & auVar69._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar69._12_4_ & uVar248 | *(uint *)(args.ray + 0xdc) & auVar69._12_4_;
                    uVar242 = *(uint *)(args.hit + 0x24);
                    uVar245 = *(uint *)(args.hit + 0x28);
                    uVar248 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~auVar69._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & auVar69._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~auVar69._4_4_ & uVar242 | *(uint *)(args.ray + 0xe4) & auVar69._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~auVar69._8_4_ & uVar245 | *(uint *)(args.ray + 0xe8) & auVar69._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~auVar69._12_4_ & uVar248 | *(uint *)(args.ray + 0xec) & auVar69._12_4_;
                    uVar242 = *(uint *)(args.hit + 0x34);
                    uVar245 = *(uint *)(args.hit + 0x38);
                    uVar248 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~auVar69._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & auVar69._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~auVar69._4_4_ & uVar242 | *(uint *)(args.ray + 0xf4) & auVar69._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~auVar69._8_4_ & uVar245 | *(uint *)(args.ray + 0xf8) & auVar69._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~auVar69._12_4_ & uVar248 | *(uint *)(args.ray + 0xfc) & auVar69._12_4_;
                    uVar242 = *(uint *)(args.hit + 0x44);
                    uVar245 = *(uint *)(args.hit + 0x48);
                    uVar248 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar69._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar69._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar69._4_4_ & uVar242 | *(uint *)(args.ray + 0x104) & auVar69._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar69._8_4_ & uVar245 | *(uint *)(args.ray + 0x108) & auVar69._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar69._12_4_ & uVar248 | *(uint *)(args.ray + 0x10c) & auVar69._12_4_;
                    uVar242 = *(uint *)(args.hit + 0x54);
                    uVar245 = *(uint *)(args.hit + 0x58);
                    uVar248 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar69._0_4_ |
                         ~auVar69._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar69._4_4_ | ~auVar69._4_4_ & uVar242;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar69._8_4_ | ~auVar69._8_4_ & uVar245;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar69._12_4_ | ~auVar69._12_4_ & uVar248;
                    uVar242 = *(uint *)(args.hit + 100);
                    uVar245 = *(uint *)(args.hit + 0x68);
                    uVar248 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar69._0_4_ |
                         ~auVar69._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar69._4_4_ | ~auVar69._4_4_ & uVar242;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar69._8_4_ | ~auVar69._8_4_ & uVar245;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar69._12_4_ | ~auVar69._12_4_ & uVar248;
                    uVar242 = *(uint *)(args.hit + 0x74);
                    uVar245 = *(uint *)(args.hit + 0x78);
                    uVar248 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar69._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar69._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar69._4_4_ & uVar242 | *(uint *)(args.ray + 0x134) & auVar69._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar69._8_4_ & uVar245 | *(uint *)(args.ray + 0x138) & auVar69._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar69._12_4_ & uVar248 | *(uint *)(args.ray + 0x13c) & auVar69._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar69 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar69;
                    pRVar45 = args.ray;
                  }
                }
                auVar90._0_4_ = auVar89._0_4_ << 0x1f;
                auVar90._4_4_ = auVar89._4_4_ << 0x1f;
                auVar90._8_4_ = auVar89._8_4_ << 0x1f;
                auVar90._12_4_ = auVar89._12_4_ << 0x1f;
                iVar46 = movmskps((int)pRVar45,auVar90);
                if (iVar46 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_12c8._0_4_;
                }
                else {
                  local_12c8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_12c8._4_4_ = 0;
                  fStack_12c0 = 0.0;
                  fStack_12bc = 0.0;
                }
                *(undefined4 *)(local_1318 + lVar42 * 4 + -0x10) = 0;
                valid.field_0.i[0] =
                     -(uint)(fVar172 <= (float)local_12c8._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fVar140 <= (float)local_12c8._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(fVar161 <= (float)local_12c8._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(fVar167 <= (float)local_12c8._0_4_) & valid.field_0.i[3];
                iVar46 = movmskps(iVar46,(undefined1  [16])valid.field_0);
                if (iVar46 == 0) break;
                auVar91._0_4_ = valid.field_0.i[0] & (uint)fVar172;
                auVar91._4_4_ = valid.field_0.i[1] & (uint)fVar140;
                auVar91._8_4_ = valid.field_0.i[2] & (uint)fVar161;
                auVar91._12_4_ = valid.field_0.i[3] & (uint)fVar167;
                auVar114._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar114._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar114._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar114 = auVar114 | auVar91;
                auVar131._4_4_ = auVar114._0_4_;
                auVar131._0_4_ = auVar114._4_4_;
                auVar131._8_4_ = auVar114._12_4_;
                auVar131._12_4_ = auVar114._8_4_;
                auVar105 = minps(auVar131,auVar114);
                auVar92._0_8_ = auVar105._8_8_;
                auVar92._8_4_ = auVar105._0_4_;
                auVar92._12_4_ = auVar105._4_4_;
                auVar105 = minps(auVar92,auVar105);
                auVar93._0_8_ =
                     CONCAT44(-(uint)(auVar105._4_4_ == auVar114._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar105._0_4_ == auVar114._0_4_) & valid.field_0.i[0]);
                auVar93._8_4_ = -(uint)(auVar105._8_4_ == auVar114._8_4_) & valid.field_0.i[2];
                auVar93._12_4_ = -(uint)(auVar105._12_4_ == auVar114._12_4_) & valid.field_0.i[3];
                iVar46 = movmskps(iVar46,auVar93);
                aVar70 = valid.field_0;
                if (iVar46 != 0) {
                  aVar70.i[2] = auVar93._8_4_;
                  aVar70._0_8_ = auVar93._0_8_;
                  aVar70.i[3] = auVar93._12_4_;
                }
                uVar56 = movmskps(iVar46,(undefined1  [16])aVar70);
                uVar48 = CONCAT44((int)((ulong)pRVar45 >> 0x20),uVar56);
                lVar42 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                  }
                }
              }
              fVar154 = *(float *)(ray + k * 4);
              fVar160 = *(float *)(ray + k * 4 + 0x10);
              fVar220 = *(float *)(ray + k * 4 + 0x20);
              local_12c8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
              local_12c8._0_4_ = local_12c8._4_4_;
              fStack_12c0 = (float)local_12c8._4_4_;
              fStack_12bc = (float)local_12c8._4_4_;
              fStack_127c = *(float *)(ray + k * 4 + 0x50);
              fVar234 = *(float *)(ray + k * 4 + 0x60);
              uVar242 = 0;
            }
          }
          local_1188._0_4_ = fVar222 - (float)local_1188;
          local_1188._4_4_ = fVar224 - local_1188._4_4_;
          fStack_1180 = fStack_1380 - fStack_1180;
          fStack_117c = fStack_137c - fStack_117c;
          fVar98 = fVar206 - fVar98;
          fVar159 = fVar208 - fVar206;
          fVar162 = fVar210 - fVar212;
          fVar116 = fVar212 - fVar116;
          fVar117 = fVar214 - fVar117;
          fVar96 = fVar217 - fVar214;
          fVar97 = fStack_1340 - fStack_1290;
          fVar132 = fStack_133c - fStack_128c;
          fVar99 = fVar99 - fVar222;
          fVar115 = fVar115 - fVar224;
          fVar71 = (float)uStack_1330 - fStack_1380;
          fVar94 = uStack_1330._4_4_ - fStack_137c;
          fVar142 = fVar142 - fVar206;
          fVar150 = fVar150 - fVar208;
          fVar138 = fVar208 - fVar210;
          fVar139 = fVar206 - fVar212;
          fVar243 = fVar243 - fVar214;
          fVar246 = fVar246 - fVar217;
          fVar204 = fVar217 - fStack_1340;
          fVar205 = fVar214 - fStack_133c;
          local_11d8[0] = fVar142 * fVar117 - fVar243 * fVar98;
          local_11d8[1] = fVar150 * fVar96 - fVar246 * fVar159;
          local_11d8[2] = fVar138 * fVar97 - fVar204 * fVar162;
          local_11d8[3] = fVar139 * fVar132 - fVar205 * fVar116;
          fVar149 = fVar243 * (float)local_1188 - fVar99 * fVar117;
          fVar151 = fVar246 * local_1188._4_4_ - fVar115 * fVar96;
          auVar164._0_8_ = CONCAT44(fVar151,fVar149);
          auVar164._8_4_ = fVar204 * fStack_1180 - fVar71 * fVar97;
          auVar164._12_4_ = fVar205 * fStack_117c - fVar94 * fVar132;
          fVar152 = fVar99 * fVar98 - fVar142 * (float)local_1188;
          fVar161 = fVar115 * fVar159 - fVar150 * local_1188._4_4_;
          local_1338 = (undefined1  [8])CONCAT44(fVar161,fVar152);
          uStack_1330._0_4_ = fVar71 * fVar162 - fVar138 * fStack_1180;
          uStack_1330._4_4_ = fVar94 * fVar116 - fVar139 * fStack_117c;
          fVar222 = fVar222 - fVar154;
          fVar224 = fVar224 - fVar154;
          fStack_1380 = fStack_1380 - fVar154;
          fStack_137c = fStack_137c - fVar154;
          fVar206 = fVar206 - fVar160;
          fVar208 = fVar208 - fVar160;
          fVar210 = fVar210 - fVar160;
          fVar212 = fVar212 - fVar160;
          fVar214 = fVar214 - fVar220;
          fVar217 = fVar217 - fVar220;
          fVar167 = fStack_1340 - fVar220;
          fVar220 = fStack_133c - fVar220;
          fVar196 = fVar206 * fVar234 - fVar214 * fStack_127c;
          fVar201 = fVar208 * fVar234 - fVar217 * fStack_127c;
          fVar202 = fVar210 * fVar234 - fVar167 * fStack_127c;
          fVar203 = fVar212 * fVar234 - fVar220 * fStack_127c;
          fVar154 = fVar214 * (float)local_12c8._0_4_ - fVar222 * fVar234;
          fVar160 = fVar217 * (float)local_12c8._4_4_ - fVar224 * fVar234;
          fVar140 = fVar167 * fStack_12c0 - fStack_1380 * fVar234;
          fVar141 = fVar220 * fStack_12bc - fStack_137c * fVar234;
          fVar168 = fVar222 * fStack_127c - fVar206 * (float)local_12c8._0_4_;
          fVar169 = fVar224 * fStack_127c - fVar208 * (float)local_12c8._4_4_;
          fVar173 = fStack_1380 * fStack_127c - fVar210 * fStack_12c0;
          fVar195 = fStack_137c * fStack_127c - fVar212 * fStack_12bc;
          fVar153 = (float)local_12c8._0_4_ * local_11d8[0] +
                    fStack_127c * fVar149 + fVar234 * fVar152;
          fVar95 = (float)local_12c8._4_4_ * local_11d8[1] +
                   fStack_127c * fVar151 + fVar234 * fVar161;
          fVar163 = fStack_12c0 * local_11d8[2] +
                    fStack_127c * auVar164._8_4_ + fVar234 * (float)uStack_1330;
          fVar172 = fStack_12bc * local_11d8[3] +
                    fStack_127c * auVar164._12_4_ + fVar234 * uStack_1330._4_4_;
          uVar245 = (uint)fVar153 & 0x80000000;
          uVar248 = (uint)fVar95 & 0x80000000;
          uVar250 = (uint)fVar163 & 0x80000000;
          uVar227 = (uint)fVar172 & 0x80000000;
          fVar142 = (float)((uint)(fVar99 * fVar196 + fVar142 * fVar154 + fVar243 * fVar168) ^
                           uVar245);
          fVar243 = (float)((uint)(fVar115 * fVar201 + fVar150 * fVar160 + fVar246 * fVar169) ^
                           uVar248);
          fVar150 = (float)((uint)(fVar71 * fVar202 + fVar138 * fVar140 + fVar204 * fVar173) ^
                           uVar250);
          fVar246 = (float)((uint)(fVar94 * fVar203 + fVar139 * fVar141 + fVar205 * fVar195) ^
                           uVar227);
          fVar234 = (float)((uint)(fVar196 * (float)local_1188 +
                                  fVar154 * fVar98 + fVar168 * fVar117) ^ uVar245);
          fVar160 = (float)((uint)(fVar201 * local_1188._4_4_ + fVar160 * fVar159 + fVar169 * fVar96
                                  ) ^ uVar248);
          fVar115 = (float)((uint)(fVar202 * fStack_1180 + fVar140 * fVar162 + fVar173 * fVar97) ^
                           uVar250);
          fVar116 = (float)((uint)(fVar203 * fStack_117c + fVar141 * fVar116 + fVar195 * fVar132) ^
                           uVar227);
          fVar162 = ABS(fVar153);
          fVar98 = ABS(fVar95);
          fVar117 = ABS(fVar163);
          fVar154 = ABS(fVar172);
          bVar24 = fVar142 + fVar234 <= fVar162 &&
                   ((0.0 <= fVar234 && 0.0 <= fVar142) && fVar153 != 0.0);
          auVar124._0_4_ = -(uint)bVar24;
          bVar25 = fVar243 + fVar160 <= fVar98 &&
                   ((0.0 <= fVar160 && 0.0 <= fVar243) && fVar95 != 0.0);
          auVar124._4_4_ = -(uint)bVar25;
          bVar23 = fVar150 + fVar115 <= fVar117 &&
                   ((0.0 <= fVar115 && 0.0 <= fVar150) && fVar163 != 0.0);
          auVar124._8_4_ = -(uint)bVar23;
          bVar21 = fVar246 + fVar116 <= fVar154 &&
                   ((0.0 <= fVar116 && 0.0 <= fVar246) && fVar172 != 0.0);
          auVar124._12_4_ = -(uint)bVar21;
          iVar46 = movmskps(uVar242,auVar124);
          uVar48 = local_1100;
          uVar53 = local_10f8;
          fVar153 = local_11a8;
          fVar163 = fStack_11a4;
          fVar172 = fStack_11a0;
          fVar159 = fStack_119c;
          if (iVar46 != 0) {
            fVar206 = (float)(uVar245 ^
                             (uint)(fVar222 * local_11d8[0] + fVar206 * fVar149 + fVar214 * fVar152)
                             );
            fVar214 = (float)(uVar248 ^
                             (uint)(fVar224 * local_11d8[1] + fVar208 * fVar151 + fVar217 * fVar161)
                             );
            fVar224 = (float)(uVar250 ^
                             (uint)(fStack_1380 * local_11d8[2] +
                                   fVar210 * auVar164._8_4_ + fVar167 * (float)uStack_1330));
            fVar208 = (float)(uVar227 ^
                             (uint)(fStack_137c * local_11d8[3] +
                                   fVar212 * auVar164._12_4_ + fVar220 * uStack_1330._4_4_));
            fVar95 = *(float *)(ray + k * 4 + 0x30);
            fVar222 = *(float *)(ray + k * 4 + 0x80);
            valid.field_0.i[0] =
                 -(uint)((fVar206 <= fVar222 * fVar162 && fVar95 * fVar162 < fVar206) && bVar24);
            valid.field_0.i[1] =
                 -(uint)((fVar214 <= fVar222 * fVar98 && fVar95 * fVar98 < fVar214) && bVar25);
            valid.field_0.i[2] =
                 -(uint)((fVar224 <= fVar222 * fVar117 && fVar95 * fVar117 < fVar224) && bVar23);
            valid.field_0.i[3] =
                 -(uint)((fVar208 <= fVar222 * fVar154 && fVar95 * fVar154 < fVar208) && bVar21);
            iVar46 = movmskps(iVar46,(undefined1  [16])valid.field_0);
            if (iVar46 != 0) {
              uStack_1390 = auVar164._8_8_;
              local_11c8 = auVar164._0_8_;
              uStack_11c0 = uStack_1390;
              local_11b8._8_8_ = uStack_1330;
              local_11b8._0_8_ = local_1338;
              auVar136._0_4_ = fVar162 - fVar234;
              auVar136._4_4_ = fVar98 - fVar160;
              auVar136._8_4_ = fVar117 - fVar115;
              auVar136._12_4_ = fVar154 - fVar116;
              auVar125._4_12_ = auVar124._4_12_;
              auVar125._0_4_ = (float)(int)(*(ushort *)(lVar10 + 8 + lVar47) - 1);
              auVar156._4_4_ = auVar124._4_4_;
              auVar156._0_4_ = auVar125._0_4_;
              auVar156._8_4_ = auVar124._8_4_;
              auVar156._12_4_ = auVar124._12_4_;
              auVar105 = rcpss(auVar156,auVar125);
              fVar95 = (2.0 - auVar125._0_4_ * auVar105._0_4_) * auVar105._0_4_;
              auVar157._4_12_ = auVar105._4_12_;
              auVar157._0_4_ = (float)(int)(*(ushort *)(lVar10 + 10 + lVar47) - 1);
              auVar165._4_4_ = auVar105._4_4_;
              auVar165._0_4_ = auVar157._0_4_;
              auVar165._8_4_ = auVar105._8_4_;
              auVar165._12_4_ = auVar105._12_4_;
              auVar105 = rcpss(auVar165,auVar157);
              fVar217 = (2.0 - auVar157._0_4_ * auVar105._0_4_) * auVar105._0_4_;
              tNear.field_0.v[0] = fVar95 * ((float)sx.field_0.i[0] * fVar162 + (fVar162 - fVar142))
              ;
              tNear.field_0.v[1] =
                   fVar95 * ((float)(sx.field_0.i[1] + 1) * fVar98 + (fVar98 - fVar243));
              tNear.field_0.v[2] =
                   fVar95 * ((float)(sx.field_0.i[2] + 1) * fVar117 + (fVar117 - fVar150));
              tNear.field_0.v[3] = fVar95 * ((float)sx.field_0.i[3] * fVar154 + (fVar154 - fVar246))
              ;
              pGVar9 = (context->scene->geometries).items[uVar38].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar16._4_4_ = fVar98;
                auVar16._0_4_ = fVar162;
                auVar16._8_4_ = fVar117;
                auVar16._12_4_ = fVar154;
                auVar105 = rcpps(auVar136,auVar16);
                fVar95 = auVar105._0_4_;
                fVar142 = auVar105._4_4_;
                fVar243 = auVar105._8_4_;
                fVar150 = auVar105._12_4_;
                fVar95 = (1.0 - fVar162 * fVar95) * fVar95 + fVar95;
                fVar142 = (1.0 - fVar98 * fVar142) * fVar142 + fVar142;
                fVar243 = (1.0 - fVar117 * fVar243) * fVar243 + fVar243;
                fVar150 = (1.0 - fVar154 * fVar150) * fVar150 + fVar150;
                fVar206 = fVar206 * fVar95;
                fVar214 = fVar214 * fVar142;
                fVar224 = fVar224 * fVar243;
                fVar208 = fVar208 * fVar150;
                local_11e8[0] = fVar206;
                local_11e8[1] = fVar214;
                local_11e8[2] = fVar224;
                local_11e8[3] = fVar208;
                local_1208[0] = tNear.field_0.v[0] * fVar95;
                local_1208[1] = tNear.field_0.v[1] * fVar142;
                local_1208[2] = tNear.field_0.v[2] * fVar243;
                local_1208[3] = tNear.field_0.v[3] * fVar150;
                local_11f8[0] = fVar217 * ((float)iVar39 * fVar162 + auVar136._0_4_) * fVar95;
                local_11f8[1] = fVar217 * ((float)iVar39 * fVar98 + auVar136._4_4_) * fVar142;
                local_11f8[2] = fVar217 * ((float)(iVar39 + 1) * fVar117 + auVar136._8_4_) * fVar243
                ;
                local_11f8[3] =
                     fVar217 * ((float)(iVar39 + 1) * fVar154 + auVar136._12_4_) * fVar150;
                auVar78._0_4_ = (uint)fVar206 & valid.field_0.i[0];
                auVar78._4_4_ = (uint)fVar214 & valid.field_0.i[1];
                auVar78._8_4_ = (uint)fVar224 & valid.field_0.i[2];
                auVar78._12_4_ = (uint)fVar208 & valid.field_0.i[3];
                auVar106._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar106._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar106._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar106 = auVar106 | auVar78;
                auVar126._4_4_ = auVar106._0_4_;
                auVar126._0_4_ = auVar106._4_4_;
                auVar126._8_4_ = auVar106._12_4_;
                auVar126._12_4_ = auVar106._8_4_;
                auVar105 = minps(auVar126,auVar106);
                auVar79._0_8_ = auVar105._8_8_;
                auVar79._8_4_ = auVar105._0_4_;
                auVar79._12_4_ = auVar105._4_4_;
                auVar105 = minps(auVar79,auVar105);
                uVar227 = -(uint)(auVar105._0_4_ == auVar106._0_4_);
                uVar58 = -(uint)(auVar105._4_4_ == auVar106._4_4_);
                uVar59 = -(uint)(auVar105._8_4_ == auVar106._8_4_);
                uVar60 = -(uint)(auVar105._12_4_ == auVar106._12_4_);
                auVar107._0_4_ = uVar227 & valid.field_0.i[0];
                auVar107._4_4_ = uVar58 & valid.field_0.i[1];
                auVar107._8_4_ = uVar59 & valid.field_0.i[2];
                auVar107._12_4_ = uVar60 & valid.field_0.i[3];
                iVar39 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar107);
                uVar242 = 0xffffffff;
                uVar245 = 0xffffffff;
                uVar248 = 0xffffffff;
                uVar250 = 0xffffffff;
                if (iVar39 != 0) {
                  uVar242 = uVar227;
                  uVar245 = uVar58;
                  uVar248 = uVar59;
                  uVar250 = uVar60;
                }
                auVar66._0_4_ = valid.field_0.i[0] & uVar242;
                auVar66._4_4_ = valid.field_0.i[1] & uVar245;
                auVar66._8_4_ = valid.field_0.i[2] & uVar248;
                auVar66._12_4_ = valid.field_0.i[3] & uVar250;
                uVar242 = movmskps(iVar39,auVar66);
                lVar42 = 0;
                if (uVar242 != 0) {
                  for (; (uVar242 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar95 = local_1208[lVar42];
                  fVar142 = local_11f8[lVar42];
                  fVar243 = local_11d8[lVar42];
                  uVar56 = *(undefined4 *)((long)&local_11c8 + lVar42 * 4);
                  uVar3 = *(undefined4 *)(local_11b8 + lVar42 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_11e8[lVar42];
                  *(float *)(ray + k * 4 + 0xc0) = fVar243;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar56;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar3;
                  *(float *)(ray + k * 4 + 0xf0) = fVar95;
                  *(float *)(ray + k * 4 + 0x100) = fVar142;
                  *(uint *)(ray + k * 4 + 0x110) = uVar7;
                  *(uint *)(ray + k * 4 + 0x120) = uVar38;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_1338._4_4_ = local_10d8._0_4_;
                  local_1338._0_4_ = local_10d8._0_4_;
                  uStack_1330._0_4_ = (float)local_10d8._0_4_;
                  uStack_1330._4_4_ = (float)local_10d8._0_4_;
                  local_1398 = CONCAT44(local_10e8._0_4_,local_10e8._0_4_);
                  uStack_1390._0_4_ = local_10e8._0_4_;
                  uStack_1390._4_4_ = local_10e8._0_4_;
                  auVar34 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar40);
                  fStack_1340 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar40 + 8);
                  fStack_133c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar40 + 8) >>
                                       0x20);
                  while( true ) {
                    local_1088 = local_1208[lVar42];
                    fVar95 = local_11f8[lVar42];
                    *(float *)(ray + k * 4 + 0x80) = local_11e8[lVar42];
                    args.context = context->user;
                    local_1078._4_4_ = fVar95;
                    local_1078._0_4_ = fVar95;
                    fStack_1070 = fVar95;
                    fStack_106c = fVar95;
                    local_10b8 = local_11d8[lVar42];
                    uVar56 = *(undefined4 *)((long)&local_11c8 + lVar42 * 4);
                    uVar3 = *(undefined4 *)(local_11b8 + lVar42 * 4);
                    local_10a8._4_4_ = uVar56;
                    local_10a8._0_4_ = uVar56;
                    local_10a8._8_4_ = uVar56;
                    local_10a8._12_4_ = uVar56;
                    local_1098._4_4_ = uVar3;
                    local_1098._0_4_ = uVar3;
                    local_1098._8_4_ = uVar3;
                    local_1098._12_4_ = uVar3;
                    fStack_10b4 = local_10b8;
                    fStack_10b0 = local_10b8;
                    fStack_10ac = local_10b8;
                    fStack_1084 = local_1088;
                    fStack_1080 = local_1088;
                    fStack_107c = local_1088;
                    local_1068 = local_1398;
                    uStack_1060 = uStack_1390;
                    local_1058 = local_1338;
                    uStack_1050 = uStack_1330;
                    local_1048 = (args.context)->instID[0];
                    uStack_1044 = local_1048;
                    uStack_1040 = local_1048;
                    uStack_103c = local_1048;
                    local_1038 = (args.context)->instPrimID[0];
                    uStack_1034 = local_1038;
                    uStack_1030 = local_1038;
                    uStack_102c = local_1038;
                    local_1318._12_4_ = fStack_133c;
                    local_1318._0_12_ = auVar34;
                    args.valid = (int *)local_1318;
                    args.geometryUserPtr = pGVar9->userPtr;
                    args.hit = (RTCHitN *)&local_10b8;
                    args.N = 4;
                    p_Var44 = pGVar9->intersectionFilterN;
                    fStack_1380 = 0.0;
                    fStack_137c = 0.0;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var44 != (RTCFilterFunctionN)0x0) {
                      p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                      fVar153 = local_11a8;
                      fVar163 = fStack_11a4;
                      fVar172 = fStack_11a0;
                      fVar159 = fStack_119c;
                    }
                    auVar84._0_4_ = -(uint)(local_1318._0_4_ == 0);
                    auVar84._4_4_ = -(uint)(local_1318._4_4_ == 0);
                    auVar84._8_4_ = -(uint)(local_1318._8_4_ == 0);
                    auVar84._12_4_ = -(uint)(local_1318._12_4_ == 0);
                    uVar38 = movmskps((int)p_Var44,auVar84);
                    pRVar45 = (RTCRayN *)(ulong)(uVar38 ^ 0xf);
                    if ((uVar38 ^ 0xf) == 0) {
                      auVar84 = auVar84 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var44 = context->args->filter;
                      if ((p_Var44 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        p_Var44 = (RTCFilterFunctionN)(*p_Var44)(&args);
                        fVar153 = local_11a8;
                        fVar163 = fStack_11a4;
                        fVar172 = fStack_11a0;
                        fVar159 = fStack_119c;
                      }
                      auVar67._0_4_ = -(uint)(local_1318._0_4_ == 0);
                      auVar67._4_4_ = -(uint)(local_1318._4_4_ == 0);
                      auVar67._8_4_ = -(uint)(local_1318._8_4_ == 0);
                      auVar67._12_4_ = -(uint)(local_1318._12_4_ == 0);
                      auVar84 = auVar67 ^ _DAT_01f46b70;
                      uVar38 = movmskps((int)p_Var44,auVar67);
                      pRVar45 = (RTCRayN *)(ulong)(uVar38 ^ 0xf);
                      if ((uVar38 ^ 0xf) != 0) {
                        auVar109._0_4_ = *(uint *)(args.ray + 0xc0) & auVar67._0_4_;
                        auVar109._4_4_ = *(uint *)(args.ray + 0xc4) & auVar67._4_4_;
                        auVar109._8_4_ = *(uint *)(args.ray + 200) & auVar67._8_4_;
                        auVar109._12_4_ = *(uint *)(args.ray + 0xcc) & auVar67._12_4_;
                        auVar158._0_4_ = ~auVar67._0_4_ & *(uint *)args.hit;
                        auVar158._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 4);
                        auVar158._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 8);
                        auVar158._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0xc);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar158 | auVar109;
                        uVar38 = *(uint *)(args.hit + 0x14);
                        uVar7 = *(uint *)(args.hit + 0x18);
                        uVar242 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar67._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar67._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar67._4_4_ & uVar38 | *(uint *)(args.ray + 0xd4) & auVar67._4_4_;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar67._8_4_ & uVar7 | *(uint *)(args.ray + 0xd8) & auVar67._8_4_;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar67._12_4_ & uVar242 | *(uint *)(args.ray + 0xdc) & auVar67._12_4_
                        ;
                        auVar137._0_4_ = *(uint *)(args.ray + 0xe0) & auVar67._0_4_;
                        auVar137._4_4_ = *(uint *)(args.ray + 0xe4) & auVar67._4_4_;
                        auVar137._8_4_ = *(uint *)(args.ray + 0xe8) & auVar67._8_4_;
                        auVar137._12_4_ = *(uint *)(args.ray + 0xec) & auVar67._12_4_;
                        auVar110._0_4_ = ~auVar67._0_4_ & *(uint *)(args.hit + 0x20);
                        auVar110._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 0x24);
                        auVar110._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 0x28);
                        auVar110._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0x2c);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar110 | auVar137;
                        auVar148._0_4_ = *(uint *)(args.ray + 0xf0) & auVar67._0_4_;
                        auVar148._4_4_ = *(uint *)(args.ray + 0xf4) & auVar67._4_4_;
                        auVar148._8_4_ = *(uint *)(args.ray + 0xf8) & auVar67._8_4_;
                        auVar148._12_4_ = *(uint *)(args.ray + 0xfc) & auVar67._12_4_;
                        auVar111._0_4_ = ~auVar67._0_4_ & *(uint *)(args.hit + 0x30);
                        auVar111._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 0x34);
                        auVar111._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 0x38);
                        auVar111._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0x3c);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar111 | auVar148;
                        uVar38 = *(uint *)(args.hit + 0x44);
                        uVar7 = *(uint *)(args.hit + 0x48);
                        uVar242 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar67._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar67._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar67._4_4_ & uVar38 | *(uint *)(args.ray + 0x104) & auVar67._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar67._8_4_ & uVar7 | *(uint *)(args.ray + 0x108) & auVar67._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar67._12_4_ & uVar242 |
                             *(uint *)(args.ray + 0x10c) & auVar67._12_4_;
                        uVar38 = *(uint *)(args.hit + 0x54);
                        uVar7 = *(uint *)(args.hit + 0x58);
                        uVar242 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar67._0_4_ |
                             ~auVar67._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar67._4_4_ | ~auVar67._4_4_ & uVar38;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar67._8_4_ | ~auVar67._8_4_ & uVar7;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar67._12_4_ |
                             ~auVar67._12_4_ & uVar242;
                        uVar38 = *(uint *)(args.hit + 100);
                        uVar7 = *(uint *)(args.hit + 0x68);
                        uVar242 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar67._0_4_ |
                             ~auVar67._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar67._4_4_ | ~auVar67._4_4_ & uVar38;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar67._8_4_ | ~auVar67._8_4_ & uVar7;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar67._12_4_ | ~auVar67._12_4_ & uVar242;
                        auVar112._0_4_ = *(uint *)(args.ray + 0x130) & auVar67._0_4_;
                        auVar112._4_4_ = *(uint *)(args.ray + 0x134) & auVar67._4_4_;
                        auVar112._8_4_ = *(uint *)(args.ray + 0x138) & auVar67._8_4_;
                        auVar112._12_4_ = *(uint *)(args.ray + 0x13c) & auVar67._12_4_;
                        auVar129._0_4_ = ~auVar67._0_4_ & *(uint *)(args.hit + 0x70);
                        auVar129._4_4_ = ~auVar67._4_4_ & *(uint *)(args.hit + 0x74);
                        auVar129._8_4_ = ~auVar67._8_4_ & *(uint *)(args.hit + 0x78);
                        auVar129._12_4_ = ~auVar67._12_4_ & *(uint *)(args.hit + 0x7c);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar129 | auVar112;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar67 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar67;
                        pRVar45 = args.ray;
                      }
                    }
                    auVar85._0_4_ = auVar84._0_4_ << 0x1f;
                    auVar85._4_4_ = auVar84._4_4_ << 0x1f;
                    auVar85._8_4_ = auVar84._8_4_ << 0x1f;
                    auVar85._12_4_ = auVar84._12_4_ << 0x1f;
                    iVar39 = movmskps((int)pRVar45,auVar85);
                    if (iVar39 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar222;
                    }
                    else {
                      fVar222 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1318 + lVar42 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(fVar206 <= fVar222) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(fVar214 <= fVar222) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(fVar224 <= fVar222) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(fVar208 <= fVar222) & valid.field_0.i[3];
                    iVar39 = movmskps(iVar39,(undefined1  [16])valid.field_0);
                    uVar48 = local_1100;
                    uVar53 = local_10f8;
                    if (iVar39 == 0) break;
                    auVar86._0_4_ = valid.field_0.i[0] & (uint)fVar206;
                    auVar86._4_4_ = valid.field_0.i[1] & (uint)fVar214;
                    auVar86._8_4_ = valid.field_0.i[2] & (uint)fVar224;
                    auVar86._12_4_ = valid.field_0.i[3] & (uint)fVar208;
                    auVar113._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar113._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar113._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar113 = auVar113 | auVar86;
                    auVar130._4_4_ = auVar113._0_4_;
                    auVar130._0_4_ = auVar113._4_4_;
                    auVar130._8_4_ = auVar113._12_4_;
                    auVar130._12_4_ = auVar113._8_4_;
                    auVar105 = minps(auVar130,auVar113);
                    auVar87._0_8_ = auVar105._8_8_;
                    auVar87._8_4_ = auVar105._0_4_;
                    auVar87._12_4_ = auVar105._4_4_;
                    auVar105 = minps(auVar87,auVar105);
                    auVar88._0_8_ =
                         CONCAT44(-(uint)(auVar105._4_4_ == auVar113._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar105._0_4_ == auVar113._0_4_) & valid.field_0.i[0]);
                    auVar88._8_4_ = -(uint)(auVar105._8_4_ == auVar113._8_4_) & valid.field_0.i[2];
                    auVar88._12_4_ =
                         -(uint)(auVar105._12_4_ == auVar113._12_4_) & valid.field_0.i[3];
                    iVar39 = movmskps(iVar39,auVar88);
                    aVar68 = valid.field_0;
                    if (iVar39 != 0) {
                      aVar68.i[2] = auVar88._8_4_;
                      aVar68._0_8_ = auVar88._0_8_;
                      aVar68.i[3] = auVar88._12_4_;
                    }
                    uVar56 = movmskps(iVar39,(undefined1  [16])aVar68);
                    uVar48 = CONCAT44((int)((ulong)pRVar45 >> 0x20),uVar56);
                    lVar42 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar51 = local_1120;
      uVar52 = local_1128;
      uVar57 = local_1130;
      auVar105 = local_1018;
      auVar146 = local_1008;
      fVar95 = local_1028;
      fVar142 = fStack_1024;
      fVar243 = fStack_1020;
      fVar162 = fStack_101c;
    }
    local_1178 = *(float *)(ray + k * 4 + 0x80);
    fStack_1174 = local_1178;
    fStack_1170 = local_1178;
    fStack_116c = local_1178;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }